

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  float *pfVar6;
  size_type sVar7;
  undefined1 (*pauVar8) [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int remain_7;
  float *outptr_15;
  float *ptr_15;
  int q_15;
  Mat *bottom_blob2_7;
  size_t b_7;
  int remain_6;
  float *outptr_14;
  float *ptr1_7;
  float *ptr_14;
  int q_14;
  Mat *bottom_blob1_7;
  int remain_5;
  float *outptr_13;
  float *ptr_13;
  int q_13;
  float coeff;
  Mat *bottom_blob2_6;
  size_t b_6;
  int remain_4;
  float *outptr_12;
  float *ptr1_6;
  float *ptr_12;
  int q_12;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_6;
  int remain_3;
  float *outptr_11;
  float *ptr_11;
  int q_11;
  Mat *bottom_blob2_5;
  size_t b_5;
  int remain_2;
  float *outptr_10;
  float *ptr1_5;
  float *ptr_10;
  int q_10;
  Mat *bottom_blob1_5;
  int remain_1;
  float *outptr_9;
  float *ptr_9;
  int q_9;
  Mat *bottom_blob2_4;
  size_t b_4;
  int remain;
  float *outptr_8;
  float *ptr1_4;
  float *ptr_8;
  int q_8;
  Mat *bottom_blob1_4;
  __m128 _p1_7;
  __m128 _p_7;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m128 _p1_6;
  __m128 _p_6;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m128 _p_5;
  __m128 _p1_5;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  __m128 _coeff;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m128 _p1_4;
  __m128 _p_4;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  __m128 _coeff1;
  __m128 _coeff0;
  Mat *bottom_blob1_2;
  __m128 _p1_3;
  __m128 _p_3;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m128 _p1_2;
  __m128 _p_2;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m128 _p1_1;
  __m128 _p_1;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m128 _p1;
  __m128 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *in_stack_ffffffffffffe9f0;
  Mat *pMVar9;
  Allocator *in_stack_ffffffffffffea00;
  Mat *in_stack_ffffffffffffea08;
  Mat *in_stack_ffffffffffffea10;
  ulong uVar10;
  Mat *in_stack_ffffffffffffea18;
  int local_133c;
  Mat local_1338;
  float *local_12f0;
  Mat local_12e8;
  float *local_12a0;
  int local_1294;
  const_reference local_1290;
  ulong local_1288;
  int local_127c;
  Mat local_1278;
  float *local_1230;
  Mat local_1228;
  float *local_11e0;
  Mat local_11d8;
  float *local_1190;
  int local_1184;
  const_reference local_1180;
  int local_1174;
  Mat local_1170;
  float *local_1128;
  Mat local_1120;
  float *local_10d8;
  int local_10d0;
  float local_10cc;
  const_reference local_10c8;
  ulong local_10c0;
  int local_10b4;
  Mat local_10b0;
  float *local_1068;
  Mat local_1060;
  float *local_1018;
  Mat local_1010;
  float *local_fc8;
  int local_fbc;
  float local_fb8;
  float local_fb4;
  const_reference local_fb0;
  int local_fa4;
  Mat local_fa0;
  float *local_f58;
  Mat local_f50;
  float *local_f08;
  int local_efc;
  const_reference local_ef8;
  ulong local_ef0;
  int local_ee4;
  Mat local_ee0;
  float *local_e98;
  Mat local_e90;
  float *local_e48;
  Mat local_e40;
  float *local_df8;
  int local_dec;
  const_reference local_de8;
  int local_ddc;
  Mat local_dd8;
  float *local_d90;
  Mat local_d88;
  float *local_d40;
  int local_d34;
  const_reference local_d30;
  ulong local_d28;
  int local_d1c;
  Mat local_d18;
  float *local_cd0;
  Mat local_cc8;
  float *local_c80;
  Mat local_c78;
  float *local_c30;
  int local_c24;
  const_reference local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined1 local_c08 [16];
  int local_bf4;
  Mat local_bf0;
  undefined1 (*local_ba8) [16];
  Mat local_ba0;
  undefined1 (*local_b58) [16];
  int local_b4c;
  const_reference local_b48;
  ulong local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined1 local_b28 [16];
  int local_b0c;
  Mat local_b08;
  float *local_ac0;
  Mat local_ab8;
  undefined1 (*local_a70) [16];
  Mat local_a68;
  undefined1 (*local_a20) [16];
  int local_a14;
  const_reference local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  int local_9e4;
  Mat local_9e0;
  float *local_998;
  Mat local_990;
  float *local_948;
  int local_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  const_reference local_928;
  ulong local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  int local_8f4;
  Mat local_8f0;
  float *local_8a8;
  Mat local_8a0;
  float *local_858;
  Mat local_850;
  float *local_808;
  int local_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  const_reference local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  int local_7a4;
  Mat local_7a0;
  float *local_758;
  Mat local_750;
  float *local_708;
  int local_6fc;
  const_reference local_6f8;
  ulong local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  int local_6bc;
  Mat local_6b8;
  float *local_670;
  Mat local_668;
  float *local_620;
  Mat local_618;
  float *local_5d0;
  int local_5c4;
  const_reference local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  int local_594;
  Mat local_590;
  float *local_548;
  Mat local_540;
  float *local_4f8;
  int local_4ec;
  const_reference local_4e8;
  ulong local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  int local_4ac;
  Mat local_4a8;
  float *local_460;
  Mat local_458;
  float *local_410;
  Mat local_3f8;
  float *local_3b0;
  int local_3a4;
  const_reference local_3a0;
  reference local_398;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  const_reference local_378;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_368;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_360;
  int local_34c;
  undefined1 (*local_348) [16];
  undefined1 (*local_340) [16];
  undefined1 (*local_338) [16];
  undefined1 (*local_330) [16];
  float *local_328;
  float *local_320;
  float *local_318;
  float *local_310;
  float *local_308;
  float *local_300;
  float *local_2f8;
  float *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float *local_2d8;
  float *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 (*local_210) [16];
  undefined8 local_208;
  undefined8 uStack_200;
  float *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_368 = in_RDX;
  local_360 = in_RSI;
  local_378 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_37c = local_378->w;
  local_380 = local_378->h;
  local_384 = local_378->c;
  local_388 = local_378->elempack;
  local_38c = local_37c * local_380;
  local_398 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_368,0);
  ncnn::Mat::create_like
            (in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,in_stack_ffffffffffffea00);
  bVar5 = ncnn::Mat::empty(in_stack_ffffffffffffe9f0);
  if (bVar5) {
    local_34c = -100;
  }
  else if (local_388 == 4) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_3a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
      for (local_3a4 = 0; local_3a4 < local_384; local_3a4 = local_3a4 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_3f8);
        ncnn::Mat::~Mat((Mat *)0x37b727);
        local_3b0 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_458);
        ncnn::Mat::~Mat((Mat *)0x37b77f);
        local_410 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_4a8);
        ncnn::Mat::~Mat((Mat *)0x37b7d7);
        local_460 = pfVar6;
        for (local_4ac = 0; local_4ac < local_38c; local_4ac = local_4ac + 1) {
          local_2d0 = local_3b0;
          uVar1 = *(undefined8 *)local_3b0;
          uVar2 = *(undefined8 *)(local_3b0 + 2);
          local_2d8 = local_410;
          local_4d8 = *(undefined8 *)local_410;
          uStack_4d0 = *(undefined8 *)(local_410 + 2);
          local_238._0_4_ = (float)uVar1;
          local_238._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_230._0_4_ = (float)uVar2;
          uStack_230._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_248._0_4_ = (float)local_4d8;
          local_248._4_4_ = (float)((ulong)local_4d8 >> 0x20);
          uStack_240._0_4_ = (float)uStack_4d0;
          uStack_240._4_4_ = (float)((ulong)uStack_4d0 >> 0x20);
          local_4c8 = CONCAT44(local_238._4_4_ * local_248._4_4_,(float)local_238 * (float)local_248
                              );
          uStack_4c0 = CONCAT44(uStack_230._4_4_ * uStack_240._4_4_,
                                (float)uStack_230 * (float)uStack_240);
          local_130 = local_460;
          local_148 = local_4c8;
          uStack_140 = uStack_4c0;
          *(undefined8 *)local_460 = local_4c8;
          *(undefined8 *)(local_460 + 2) = uStack_4c0;
          local_3b0 = local_3b0 + 4;
          local_410 = local_410 + 4;
          local_460 = local_460 + 4;
          local_248 = local_4d8;
          uStack_240 = uStack_4d0;
          local_238 = uVar1;
          uStack_230 = uVar2;
        }
      }
      for (local_4e0 = 2; uVar10 = local_4e0,
          sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
          uVar10 < sVar7; local_4e0 = local_4e0 + 1) {
        local_4e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_360,local_4e0);
        for (local_4ec = 0; local_4ec < local_384; local_4ec = local_4ec + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_540);
          ncnn::Mat::~Mat((Mat *)0x37ba54);
          local_4f8 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_590);
          ncnn::Mat::~Mat((Mat *)0x37baac);
          local_548 = pfVar6;
          for (local_594 = 0; local_594 < local_38c; local_594 = local_594 + 1) {
            local_2e0 = local_548;
            uVar1 = *(undefined8 *)local_548;
            uVar2 = *(undefined8 *)(local_548 + 2);
            local_2e8 = local_4f8;
            local_5b8 = *(undefined8 *)local_4f8;
            uStack_5b0 = *(undefined8 *)(local_4f8 + 2);
            local_258._0_4_ = (float)uVar1;
            local_258._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_250._0_4_ = (float)uVar2;
            uStack_250._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_268._0_4_ = (float)local_5b8;
            local_268._4_4_ = (float)((ulong)local_5b8 >> 0x20);
            uStack_260._0_4_ = (float)uStack_5b0;
            uStack_260._4_4_ = (float)((ulong)uStack_5b0 >> 0x20);
            local_5a8 = CONCAT44(local_258._4_4_ * local_268._4_4_,
                                 (float)local_258 * (float)local_268);
            uStack_5a0 = CONCAT44(uStack_250._4_4_ * uStack_260._4_4_,
                                  (float)uStack_250 * (float)uStack_260);
            local_150 = local_548;
            local_168 = local_5a8;
            uStack_160 = uStack_5a0;
            *(undefined8 *)local_548 = local_5a8;
            *(undefined8 *)(local_548 + 2) = uStack_5a0;
            local_4f8 = local_4f8 + 4;
            local_548 = local_548 + 4;
            local_268 = local_5b8;
            uStack_260 = uStack_5b0;
            local_258 = uVar1;
            uStack_250 = uVar2;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_5c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
        for (local_5c4 = 0; local_5c4 < local_384; local_5c4 = local_5c4 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_618);
          ncnn::Mat::~Mat((Mat *)0x37bd06);
          local_5d0 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_668);
          ncnn::Mat::~Mat((Mat *)0x37bd5e);
          local_620 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_6b8);
          ncnn::Mat::~Mat((Mat *)0x37bdb6);
          local_670 = pfVar6;
          for (local_6bc = 0; local_6bc < local_38c; local_6bc = local_6bc + 1) {
            local_2f0 = local_5d0;
            uVar1 = *(undefined8 *)local_5d0;
            uVar2 = *(undefined8 *)(local_5d0 + 2);
            local_2f8 = local_620;
            local_6e8 = *(undefined8 *)local_620;
            uStack_6e0 = *(undefined8 *)(local_620 + 2);
            local_b8._0_4_ = (float)uVar1;
            local_b8._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_b0._0_4_ = (float)uVar2;
            uStack_b0._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_c8._0_4_ = (float)local_6e8;
            local_c8._4_4_ = (float)((ulong)local_6e8 >> 0x20);
            uStack_c0._0_4_ = (float)uStack_6e0;
            uStack_c0._4_4_ = (float)((ulong)uStack_6e0 >> 0x20);
            local_6d8 = CONCAT44(local_b8._4_4_ + local_c8._4_4_,(float)local_b8 + (float)local_c8);
            uStack_6d0 = CONCAT44(uStack_b0._4_4_ + uStack_c0._4_4_,
                                  (float)uStack_b0 + (float)uStack_c0);
            local_170 = local_670;
            local_188 = local_6d8;
            uStack_180 = uStack_6d0;
            *(undefined8 *)local_670 = local_6d8;
            *(undefined8 *)(local_670 + 2) = uStack_6d0;
            local_5d0 = local_5d0 + 4;
            local_620 = local_620 + 4;
            local_670 = local_670 + 4;
            local_c8 = local_6e8;
            uStack_c0 = uStack_6e0;
            local_b8 = uVar1;
            uStack_b0 = uVar2;
          }
        }
        for (local_6f0 = 2; uVar10 = local_6f0,
            sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
            uVar10 < sVar7; local_6f0 = local_6f0 + 1) {
          local_6f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_360,local_6f0);
          for (local_6fc = 0; local_6fc < local_384; local_6fc = local_6fc + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_750);
            ncnn::Mat::~Mat((Mat *)0x37c033);
            local_708 = pfVar6;
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_7a0);
            ncnn::Mat::~Mat((Mat *)0x37c08b);
            local_758 = pfVar6;
            for (local_7a4 = 0; local_7a4 < local_38c; local_7a4 = local_7a4 + 1) {
              local_300 = local_758;
              uVar1 = *(undefined8 *)local_758;
              uVar2 = *(undefined8 *)(local_758 + 2);
              local_308 = local_708;
              local_7c8 = *(undefined8 *)local_708;
              uStack_7c0 = *(undefined8 *)(local_708 + 2);
              local_d8._0_4_ = (float)uVar1;
              local_d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
              uStack_d0._0_4_ = (float)uVar2;
              uStack_d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
              local_e8._0_4_ = (float)local_7c8;
              local_e8._4_4_ = (float)((ulong)local_7c8 >> 0x20);
              uStack_e0._0_4_ = (float)uStack_7c0;
              uStack_e0._4_4_ = (float)((ulong)uStack_7c0 >> 0x20);
              local_7b8 = CONCAT44(local_d8._4_4_ + local_e8._4_4_,(float)local_d8 + (float)local_e8
                                  );
              uStack_7b0 = CONCAT44(uStack_d0._4_4_ + uStack_e0._4_4_,
                                    (float)uStack_d0 + (float)uStack_e0);
              local_190 = local_758;
              local_1a8 = local_7b8;
              uStack_1a0 = uStack_7b0;
              *(undefined8 *)local_758 = local_7b8;
              *(undefined8 *)(local_758 + 2) = uStack_7b0;
              local_708 = local_708 + 4;
              local_758 = local_758 + 4;
              local_e8 = local_7c8;
              uStack_e0 = uStack_7c0;
              local_d8 = uVar1;
              uStack_d0 = uVar2;
            }
          }
        }
      }
      else {
        local_7d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
        pfVar6 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0);
        local_68 = *pfVar6;
        local_7e8 = CONCAT44(local_68,local_68);
        uStack_7e0 = CONCAT44(local_68,local_68);
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        local_4c = local_68;
        pfVar6 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1);
        local_88 = *pfVar6;
        local_7f8 = CONCAT44(local_88,local_88);
        uStack_7f0 = CONCAT44(local_88,local_88);
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_78 = local_88;
        for (local_7fc = 0; local_7fc < local_384; local_7fc = local_7fc + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_850);
          ncnn::Mat::~Mat((Mat *)0x37c363);
          local_808 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_8a0);
          ncnn::Mat::~Mat((Mat *)0x37c3bb);
          local_858 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_8f0);
          ncnn::Mat::~Mat((Mat *)0x37c413);
          local_8a8 = pfVar6;
          for (local_8f4 = 0; local_8f4 < local_38c; local_8f4 = local_8f4 + 1) {
            local_310 = local_808;
            uVar1 = *(undefined8 *)local_808;
            uVar2 = *(undefined8 *)(local_808 + 2);
            local_318 = local_858;
            uVar3 = *(undefined8 *)local_858;
            uVar4 = *(undefined8 *)(local_858 + 2);
            local_278._0_4_ = (float)uVar1;
            local_278._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_270._0_4_ = (float)uVar2;
            uStack_270._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_288._0_4_ = (float)local_7e8;
            local_288._4_4_ = (float)((ulong)local_7e8 >> 0x20);
            uStack_280._0_4_ = (float)uStack_7e0;
            uStack_280._4_4_ = (float)((ulong)uStack_7e0 >> 0x20);
            local_908 = CONCAT44(local_278._4_4_ * local_288._4_4_,
                                 (float)local_278 * (float)local_288);
            uStack_900 = CONCAT44(uStack_270._4_4_ * uStack_280._4_4_,
                                  (float)uStack_270 * (float)uStack_280);
            local_298._0_4_ = (float)uVar3;
            local_298._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_290._0_4_ = (float)uVar4;
            uStack_290._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_2a8._0_4_ = (float)local_7f8;
            local_2a8._4_4_ = (float)((ulong)local_7f8 >> 0x20);
            uStack_2a0._0_4_ = (float)uStack_7f0;
            uStack_2a0._4_4_ = (float)((ulong)uStack_7f0 >> 0x20);
            local_918 = CONCAT44(local_298._4_4_ * local_2a8._4_4_,
                                 (float)local_298 * (float)local_2a8);
            uStack_910 = CONCAT44(uStack_290._4_4_ * uStack_2a0._4_4_,
                                  (float)uStack_290 * (float)uStack_2a0);
            local_f8 = local_918;
            uStack_f0 = uStack_910;
            local_108 = local_908;
            uStack_100 = uStack_900;
            local_908 = CONCAT44(local_298._4_4_ * local_2a8._4_4_ +
                                 local_278._4_4_ * local_288._4_4_,
                                 (float)local_298 * (float)local_2a8 +
                                 (float)local_278 * (float)local_288);
            uStack_900 = CONCAT44(uStack_290._4_4_ * uStack_2a0._4_4_ +
                                  uStack_270._4_4_ * uStack_280._4_4_,
                                  (float)uStack_290 * (float)uStack_2a0 +
                                  (float)uStack_270 * (float)uStack_280);
            local_1b0 = local_8a8;
            local_1c8 = local_908;
            uStack_1c0 = uStack_900;
            *(undefined8 *)local_8a8 = local_908;
            *(undefined8 *)(local_8a8 + 2) = uStack_900;
            local_808 = local_808 + 4;
            local_858 = local_858 + 4;
            local_8a8 = local_8a8 + 4;
            local_2a8 = local_7f8;
            uStack_2a0 = uStack_7f0;
            local_298 = uVar3;
            uStack_290 = uVar4;
            local_288 = local_7e8;
            uStack_280 = uStack_7e0;
            local_278 = uVar1;
            uStack_270 = uVar2;
          }
        }
        for (local_920 = 2; uVar10 = local_920,
            sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
            uVar10 < sVar7; local_920 = local_920 + 1) {
          local_928 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_360,local_920);
          pfVar6 = ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_920);
          local_a8 = *pfVar6;
          local_938 = CONCAT44(local_a8,local_a8);
          uStack_930 = CONCAT44(local_a8,local_a8);
          fStack_a4 = local_a8;
          fStack_a0 = local_a8;
          fStack_9c = local_a8;
          local_98 = local_a8;
          for (local_93c = 0; local_93c < local_384; local_93c = local_93c + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_990);
            ncnn::Mat::~Mat((Mat *)0x37c758);
            local_948 = pfVar6;
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_9e0);
            ncnn::Mat::~Mat((Mat *)0x37c7b0);
            local_998 = pfVar6;
            for (local_9e4 = 0; local_9e4 < local_38c; local_9e4 = local_9e4 + 1) {
              local_320 = local_948;
              uVar1 = *(undefined8 *)local_948;
              uVar2 = *(undefined8 *)(local_948 + 2);
              local_328 = local_998;
              uVar3 = *(undefined8 *)local_998;
              uVar4 = *(undefined8 *)(local_998 + 2);
              local_2b8._0_4_ = (float)uVar1;
              local_2b8._4_4_ = (float)((ulong)uVar1 >> 0x20);
              uStack_2b0._0_4_ = (float)uVar2;
              uStack_2b0._4_4_ = (float)((ulong)uVar2 >> 0x20);
              local_2c8._0_4_ = (float)local_938;
              local_2c8._4_4_ = (float)((ulong)local_938 >> 0x20);
              uStack_2c0._0_4_ = (float)uStack_930;
              uStack_2c0._4_4_ = (float)((ulong)uStack_930 >> 0x20);
              local_9f8 = CONCAT44(local_2b8._4_4_ * local_2c8._4_4_,
                                   (float)local_2b8 * (float)local_2c8);
              uStack_9f0 = CONCAT44(uStack_2b0._4_4_ * uStack_2c0._4_4_,
                                    (float)uStack_2b0 * (float)uStack_2c0);
              local_118 = local_9f8;
              uStack_110 = uStack_9f0;
              local_128._0_4_ = (float)uVar3;
              local_128._4_4_ = (float)((ulong)uVar3 >> 0x20);
              uStack_120._0_4_ = (float)uVar4;
              uStack_120._4_4_ = (float)((ulong)uVar4 >> 0x20);
              local_a08 = CONCAT44(local_2b8._4_4_ * local_2c8._4_4_ + local_128._4_4_,
                                   (float)local_2b8 * (float)local_2c8 + (float)local_128);
              uStack_a00 = CONCAT44(uStack_2b0._4_4_ * uStack_2c0._4_4_ + uStack_120._4_4_,
                                    (float)uStack_2b0 * (float)uStack_2c0 + (float)uStack_120);
              local_1d0 = local_998;
              local_1e8 = local_a08;
              uStack_1e0 = uStack_a00;
              *(undefined8 *)local_998 = local_a08;
              *(undefined8 *)(local_998 + 2) = uStack_a00;
              local_948 = local_948 + 4;
              local_998 = local_998 + 4;
              local_2c8 = local_938;
              uStack_2c0 = uStack_930;
              local_2b8 = uVar1;
              uStack_2b0 = uVar2;
              local_128 = uVar3;
              uStack_120 = uVar4;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_a10 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
      for (local_a14 = 0; local_a14 < local_384; local_a14 = local_a14 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pauVar8 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_a68);
        ncnn::Mat::~Mat((Mat *)0x37ca27);
        local_a20 = pauVar8;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pauVar8 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_ab8);
        ncnn::Mat::~Mat((Mat *)0x37ca7f);
        local_a70 = pauVar8;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_b08);
        ncnn::Mat::~Mat((Mat *)0x37cad7);
        local_ac0 = pfVar6;
        for (local_b0c = 0; local_b0c < local_38c; local_b0c = local_b0c + 1) {
          local_330 = local_a20;
          local_18 = *(undefined8 *)*local_a20;
          uStack_10 = *(undefined8 *)(*local_a20 + 8);
          local_338 = local_a70;
          local_b38 = *(undefined8 *)*local_a70;
          uStack_b30 = *(undefined8 *)(*local_a70 + 8);
          local_b28 = maxps(*local_a20,*local_a70);
          local_1f0 = local_ac0;
          local_208 = local_b28._0_8_;
          uStack_200 = local_b28._8_8_;
          *(undefined8 *)local_ac0 = local_b28._0_8_;
          *(undefined8 *)(local_ac0 + 2) = local_b28._8_8_;
          local_a20 = local_a20 + 1;
          local_a70 = local_a70 + 1;
          local_ac0 = local_ac0 + 4;
          local_28 = local_b38;
          uStack_20 = uStack_b30;
        }
      }
      for (local_b40 = 2; uVar10 = local_b40,
          sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
          uVar10 < sVar7; local_b40 = local_b40 + 1) {
        local_b48 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_360,local_b40);
        for (local_b4c = 0; local_b4c < local_384; local_b4c = local_b4c + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pauVar8 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_ba0);
          ncnn::Mat::~Mat((Mat *)0x37cd57);
          local_b58 = pauVar8;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pauVar8 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_bf0);
          ncnn::Mat::~Mat((Mat *)0x37cdaf);
          local_ba8 = pauVar8;
          for (local_bf4 = 0; local_bf4 < local_38c; local_bf4 = local_bf4 + 1) {
            local_340 = local_ba8;
            local_38 = *(undefined8 *)*local_ba8;
            uStack_30 = *(undefined8 *)(*local_ba8 + 8);
            local_348 = local_b58;
            local_c18 = *(undefined8 *)*local_b58;
            uStack_c10 = *(undefined8 *)(*local_b58 + 8);
            local_c08 = maxps(*local_ba8,*local_b58);
            local_210 = local_ba8;
            local_228 = local_c08._0_8_;
            uStack_220 = local_c08._8_8_;
            *(undefined8 *)*local_ba8 = local_c08._0_8_;
            *(undefined8 *)(*local_ba8 + 8) = local_c08._8_8_;
            local_b58 = local_b58 + 1;
            local_ba8 = local_ba8 + 1;
            local_48 = local_c18;
            uStack_40 = uStack_c10;
          }
        }
      }
    }
    local_34c = 0;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_c20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
      for (local_c24 = 0; local_c24 < local_384; local_c24 = local_c24 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_c78);
        ncnn::Mat::~Mat((Mat *)0x37cfff);
        local_c30 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_cc8);
        ncnn::Mat::~Mat((Mat *)0x37d057);
        local_c80 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_d18);
        ncnn::Mat::~Mat((Mat *)0x37d0af);
        local_cd0 = pfVar6;
        for (local_d1c = local_38c; 0 < local_d1c; local_d1c = local_d1c + -1) {
          *local_cd0 = *local_c30 * *local_c80;
          local_c30 = local_c30 + 1;
          local_c80 = local_c80 + 1;
          local_cd0 = local_cd0 + 1;
        }
      }
      for (local_d28 = 2; uVar10 = local_d28,
          sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
          uVar10 < sVar7; local_d28 = local_d28 + 1) {
        local_d30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_360,local_d28);
        for (local_d34 = 0; local_d34 < local_384; local_d34 = local_d34 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_d88);
          ncnn::Mat::~Mat((Mat *)0x37d29c);
          local_d40 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_dd8);
          ncnn::Mat::~Mat((Mat *)0x37d2f4);
          local_d90 = pfVar6;
          for (local_ddc = local_38c; 0 < local_ddc; local_ddc = local_ddc + -1) {
            *local_d90 = *local_d40 * *local_d90;
            local_d40 = local_d40 + 1;
            local_d90 = local_d90 + 1;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_de8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
        for (local_dec = 0; local_dec < local_384; local_dec = local_dec + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_e40);
          ncnn::Mat::~Mat((Mat *)0x37d4b3);
          local_df8 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_e90);
          ncnn::Mat::~Mat((Mat *)0x37d50b);
          local_e48 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_ee0);
          ncnn::Mat::~Mat((Mat *)0x37d563);
          local_e98 = pfVar6;
          for (local_ee4 = local_38c; 0 < local_ee4; local_ee4 = local_ee4 + -1) {
            *local_e98 = *local_df8 + *local_e48;
            local_df8 = local_df8 + 1;
            local_e48 = local_e48 + 1;
            local_e98 = local_e98 + 1;
          }
        }
        for (local_ef0 = 2; uVar10 = local_ef0,
            sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
            uVar10 < sVar7; local_ef0 = local_ef0 + 1) {
          local_ef8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_360,local_ef0);
          for (local_efc = 0; local_efc < local_384; local_efc = local_efc + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_f50);
            ncnn::Mat::~Mat((Mat *)0x37d750);
            local_f08 = pfVar6;
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_fa0);
            ncnn::Mat::~Mat((Mat *)0x37d7a8);
            local_f58 = pfVar6;
            for (local_fa4 = local_38c; 0 < local_fa4; local_fa4 = local_fa4 + -1) {
              *local_f58 = *local_f08 + *local_f58;
              local_f08 = local_f08 + 1;
              local_f58 = local_f58 + 1;
            }
          }
        }
      }
      else {
        local_fb0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
        pfVar6 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),0);
        local_fb4 = *pfVar6;
        pfVar6 = ncnn::Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),1);
        local_fb8 = *pfVar6;
        for (local_fbc = 0; local_fbc < local_384; local_fbc = local_fbc + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1010);
          ncnn::Mat::~Mat((Mat *)0x37d989);
          local_fc8 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1060);
          ncnn::Mat::~Mat((Mat *)0x37d9e1);
          local_1018 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,
                             (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_10b0);
          ncnn::Mat::~Mat((Mat *)0x37da39);
          local_1068 = pfVar6;
          for (local_10b4 = local_38c; 0 < local_10b4; local_10b4 = local_10b4 + -1) {
            *local_1068 = *local_fc8 * local_fb4 + *local_1018 * local_fb8;
            local_fc8 = local_fc8 + 1;
            local_1018 = local_1018 + 1;
            local_1068 = local_1068 + 1;
          }
        }
        for (local_10c0 = 2; uVar10 = local_10c0,
            sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
            uVar10 < sVar7; local_10c0 = local_10c0 + 1) {
          local_10c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_360,local_10c0);
          pfVar6 = ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8),local_10c0);
          local_10cc = *pfVar6;
          for (local_10d0 = 0; local_10d0 < local_384; local_10d0 = local_10d0 + 1) {
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1120);
            ncnn::Mat::~Mat((Mat *)0x37dc63);
            local_10d8 = pfVar6;
            ncnn::Mat::channel(in_stack_ffffffffffffea18,
                               (int)((ulong)in_stack_ffffffffffffea10 >> 0x20));
            pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1170);
            ncnn::Mat::~Mat((Mat *)0x37dcaf);
            local_1128 = pfVar6;
            for (local_1174 = local_38c; 0 < local_1174; local_1174 = local_1174 + -1) {
              *local_1128 = *local_10d8 * local_10cc + *local_1128;
              local_10d8 = local_10d8 + 1;
              local_1128 = local_1128 + 1;
            }
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_1180 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_360,1);
      for (local_1184 = 0; local_1184 < local_384; local_1184 = local_1184 + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_11d8);
        ncnn::Mat::~Mat((Mat *)0x37de50);
        local_1190 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(&local_1228);
        ncnn::Mat::~Mat((Mat *)0x37de9c);
        in_stack_ffffffffffffea18 = &local_1278;
        local_11e0 = pfVar6;
        ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)((ulong)in_stack_ffffffffffffea10 >> 0x20)
                          );
        pfVar6 = ncnn::Mat::operator_cast_to_float_(in_stack_ffffffffffffea18);
        ncnn::Mat::~Mat((Mat *)0x37dee8);
        local_1230 = pfVar6;
        for (local_127c = local_38c; 0 < local_127c; local_127c = local_127c + -1) {
          pfVar6 = std::max<float>(local_1190,local_11e0);
          *local_1230 = *pfVar6;
          local_1190 = local_1190 + 1;
          local_11e0 = local_11e0 + 1;
          local_1230 = local_1230 + 1;
        }
      }
      local_1288 = 2;
      while (uVar10 = local_1288,
            sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_360),
            uVar10 < sVar7) {
        local_1290 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_360,local_1288);
        for (local_1294 = 0; local_1294 < local_384; local_1294 = local_1294 + 1) {
          pMVar9 = &local_12e8;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)(uVar10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(pMVar9);
          ncnn::Mat::~Mat((Mat *)0x37e0c4);
          pMVar9 = &local_1338;
          local_12a0 = pfVar6;
          ncnn::Mat::channel(in_stack_ffffffffffffea18,(int)(uVar10 >> 0x20));
          pfVar6 = ncnn::Mat::operator_cast_to_float_(pMVar9);
          ncnn::Mat::~Mat((Mat *)0x37e110);
          local_12f0 = pfVar6;
          for (local_133c = local_38c; 0 < local_133c; local_133c = local_133c + -1) {
            pfVar6 = std::max<float>(local_12a0,local_12f0);
            *local_12f0 = *pfVar6;
            local_12a0 = local_12a0 + 1;
            local_12f0 = local_12f0 + 1;
          }
        }
        local_1288 = local_1288 + 1;
      }
    }
    local_34c = 0;
  }
  return local_34c;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}